

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  long lVar1;
  size_t sVar2;
  uint *puVar3;
  
  zOut[(long)nOut + -1] = '\0';
  if (*zPath == '/') {
    sqlite3_snprintf(nOut,zOut,"%s",zPath);
  }
  else {
    lVar1 = (*aSyscall[3].pCurrent)(zOut,(long)nOut + -1);
    if (lVar1 == 0) {
      sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",28999,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
      puVar3 = (uint *)__errno_location();
      sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",28999,(ulong)*puVar3,"getcwd",zPath,"");
      return 0xe;
    }
    sVar2 = strlen(zOut);
    sqlite3_snprintf(nOut - (int)sVar2,zOut + (int)sVar2,"/%s",zPath);
  }
  return 0;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. This function could fail if, for example, the
  ** current working directory has been unlinked.
  */
  SimulateIOError( return SQLITE_ERROR );

  assert( pVfs->mxPathname==MAX_PATHNAME );
  UNUSED_PARAMETER(pVfs);

  zOut[nOut-1] = '\0';
  if( zPath[0]=='/' ){
    sqlite3_snprintf(nOut, zOut, "%s", zPath);
  }else{
    int nCwd;
    if( osGetcwd(zOut, nOut-1)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    nCwd = (int)strlen(zOut);
    sqlite3_snprintf(nOut-nCwd, &zOut[nCwd], "/%s", zPath);
  }
  return SQLITE_OK;
}